

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDwaCompressor.cpp
# Opt level: O0

int __thiscall
Imf_2_5::DwaCompressor::uncompress
          (DwaCompressor *this,char *inPtr,int inSize,Box2i *range,char **outPtr)

{
  int iVar1;
  int iVar2;
  CompressorScheme CVar3;
  char *pcVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  int *piVar9;
  InputExc *pIVar10;
  size_t sVar11;
  void *pvVar12;
  BaseExc *pBVar13;
  NoImplExc *pNVar14;
  ulong uVar15;
  size_type sVar16;
  reference pvVar17;
  reference pvVar18;
  reference pvVar19;
  reference ppcVar20;
  undefined4 *in_RCX;
  int in_EDX;
  ulong *in_RSI;
  long *in_RDI;
  vector<Imf_2_5::DwaCompressor::CscChannelSet,_std::allocator<Imf_2_5::DwaCompressor::CscChannelSet>_>
  *this_00;
  vector<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
  *this_01;
  long *in_R8;
  reference rVar21;
  reference rVar22;
  int y_2;
  int dstScanlineSize;
  int row_1;
  int byte;
  int x;
  char *dst_1;
  int y_1;
  int row;
  LossyDctDecoder decoder_1;
  unsigned_short *linearLut;
  int pixelSize;
  ChannelData *cd_1;
  uint chan_2;
  LossyDctDecoderCsc decoder;
  int bChan;
  int gChan;
  int rChan;
  uint csc;
  ChannelData *cd;
  uint chan_1;
  int y;
  uint chan;
  vector<std::vector<char_*,_std::allocator<char_*>_>,_std::allocator<std::vector<char_*,_std::allocator<char_*>_>_>_>
  rowPtrs;
  vector<bool,_std::allocator<bool>_> decodedChannels;
  uLongf dstLen;
  uLongf destLen;
  uLongf outSize;
  char *compressedRleBuf;
  char *compressedDcBuf;
  char *compressedAcBuf;
  char *compressedUnknownBuf;
  char *packedDcBufferEnd;
  char *packedAcBufferEnd;
  char *outBufferEnd;
  size_t outBufferSize;
  Classifier rule;
  unsigned_short ruleSize;
  char *dataPtr;
  Int64 compressedSize;
  Int64 acCompression;
  Int64 totalDcUncompressedCount;
  Int64 totalAcUncompressedCount;
  Int64 rleRawSize;
  Int64 rleUncompressedSize;
  Int64 rleCompressedSize;
  Int64 dcCompressedSize;
  Int64 acCompressedSize;
  Int64 unknownCompressedSize;
  Int64 unknownUncompressedSize;
  Int64 version;
  Int64 *inPtr64;
  char *src;
  Int64 *dst;
  int i;
  Int64 headerSize;
  Int64 iSize;
  int maxY;
  int minY;
  int maxX;
  int minX;
  int in_stack_00004e8c;
  unsigned_short *in_stack_00004e90;
  int in_stack_00004e9c;
  char *in_stack_00004ea0;
  unsigned_long *in_stack_fffffffffffffa18;
  PixelType in_stack_fffffffffffffa20;
  PixelType in_stack_fffffffffffffa24;
  undefined4 in_stack_fffffffffffffa28;
  int in_stack_fffffffffffffa2c;
  PixelType in_stack_fffffffffffffa30;
  undefined4 in_stack_fffffffffffffa34;
  PixelType in_stack_fffffffffffffa38;
  int in_stack_fffffffffffffa3c;
  PixelType in_stack_fffffffffffffa40;
  undefined4 in_stack_fffffffffffffa44;
  undefined4 in_stack_fffffffffffffa48;
  undefined4 in_stack_fffffffffffffa4c;
  LossyDctDecoderCsc *in_stack_fffffffffffffa50;
  unsigned_short *in_stack_fffffffffffffa60;
  undefined8 in_stack_fffffffffffffa68;
  int in_stack_fffffffffffffa70;
  int in_stack_fffffffffffffa74;
  PixelType in_stack_fffffffffffffa78;
  int in_stack_fffffffffffffa7c;
  PixelType in_stack_fffffffffffffa80;
  undefined4 in_stack_fffffffffffffa84;
  PixelType in_stack_fffffffffffffa88;
  _Bit_type *in_stack_fffffffffffffab0;
  _Bit_type in_stack_fffffffffffffab8;
  _Bit_type *in_stack_fffffffffffffac0;
  char *in_stack_fffffffffffffac8;
  size_t *in_stack_fffffffffffffb28;
  DwaCompressor *in_stack_fffffffffffffb30;
  undefined8 in_stack_fffffffffffffbb0;
  char **in_stack_fffffffffffffbb8;
  Classifier *in_stack_fffffffffffffbc0;
  reference local_398;
  int local_384;
  int local_380;
  int local_37c;
  int local_378;
  int local_374;
  char *local_370;
  int local_368;
  int local_364;
  LossyDctDecoderBase local_360;
  undefined1 *local_2e0;
  int local_2d4;
  reference local_2d0;
  reference local_2c8;
  uint local_2b4;
  _Bit_reference local_2b0;
  reference local_2a0;
  reference local_290 [4];
  LossyDctDecoderBase *in_stack_fffffffffffffdb8;
  uint local_1f4;
  uint local_1e8;
  int local_1e4;
  reference local_1e0;
  uint local_1d0;
  vector<std::vector<char_*,_std::allocator<char_*>_>,_std::allocator<std::vector<char_*,_std::allocator<char_*>_>_>_>
  local_1c8 [3];
  ulong local_180;
  long local_178;
  ulong local_170;
  long local_168;
  long local_160;
  long local_158;
  ulong *local_150;
  long local_148;
  long local_140;
  long local_138;
  undefined8 local_130;
  ushort local_e2;
  ulong *local_e0;
  long local_d8;
  ulong local_d0;
  ulong local_c8;
  ulong local_c0;
  ulong local_b8;
  ulong local_b0;
  ulong local_a8;
  ulong local_a0;
  ulong local_98;
  ulong local_90;
  ulong local_88;
  ulong local_80;
  ulong *local_78;
  ulong *local_70;
  ulong *local_68;
  int local_5c;
  long local_58;
  ulong local_50;
  int local_48;
  int local_44;
  int local_40;
  undefined4 local_3c;
  long *local_38;
  int local_24;
  ulong *local_20;
  
  local_3c = *in_RCX;
  local_38 = in_R8;
  local_24 = in_EDX;
  local_20 = in_RSI;
  piVar9 = std::min<int>(in_RCX + 2,(int *)((long)in_RDI + 0x24));
  local_40 = *piVar9;
  local_44 = in_RCX[1];
  piVar9 = std::min<int>(in_RCX + 3,(int *)(in_RDI + 5));
  local_48 = *piVar9;
  local_50 = (ulong)local_24;
  local_58 = 0x58;
  if (local_50 < 0x58) {
    pIVar10 = (InputExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::InputExc::InputExc(pIVar10,"Error uncompressing DWA data(truncated header).");
    __cxa_throw(pIVar10,&Iex_2_5::InputExc::typeinfo,Iex_2_5::InputExc::~InputExc);
  }
  for (local_5c = 0; local_5c < 0xb; local_5c = local_5c + 1) {
    local_68 = local_20 + local_5c;
    local_70 = local_20 + local_5c;
    Xdr::read<Imf_2_5::CharPtrIO,char_const*>
              ((char **)CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20),
               in_stack_fffffffffffffa18);
  }
  local_78 = local_20;
  local_80 = *local_20;
  local_88 = local_20[1];
  local_90 = local_20[2];
  local_98 = local_20[3];
  local_a0 = local_20[4];
  local_a8 = local_20[5];
  local_b0 = local_20[6];
  local_b8 = local_20[7];
  local_c0 = local_20[8];
  local_c8 = local_20[9];
  local_d0 = local_20[10];
  local_d8 = local_90 + local_98 + local_a0 + local_a8;
  local_e0 = local_20 + 0xb;
  if ((((local_50 < (ulong)(local_58 + local_d8)) || (local_50 < local_90)) || (local_50 < local_98)
      ) || ((local_50 < local_a0 || (local_50 < local_a8)))) {
    pIVar10 = (InputExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::InputExc::InputExc(pIVar10,"Error uncompressing DWA data(truncated file).");
    __cxa_throw(pIVar10,&Iex_2_5::InputExc::typeinfo,Iex_2_5::InputExc::~InputExc);
  }
  if ((((((long)local_88 < 0) || ((long)local_90 < 0)) ||
       (((long)local_98 < 0 ||
        ((((long)local_a0 < 0 || ((long)local_a8 < 0)) || ((long)local_b0 < 0)))))) ||
      (((long)local_b8 < 0 || ((long)local_c0 < 0)))) || ((long)local_c8 < 0)) {
    pIVar10 = (InputExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::InputExc::InputExc(pIVar10,"Error uncompressing DWA data (corrupt header).");
    __cxa_throw(pIVar10,&Iex_2_5::InputExc::typeinfo,Iex_2_5::InputExc::~InputExc);
  }
  if (local_80 < 2) {
    initializeLegacyChannelRules
              ((DwaCompressor *)
               decodedChannels.super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p);
  }
  else {
    local_e2 = 0;
    Xdr::read<Imf_2_5::CharPtrIO,char_const*>
              ((char **)CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20),
               (unsigned_short *)in_stack_fffffffffffffa18);
    uVar6 = (uint)local_e2;
    iVar8 = Xdr::size<unsigned_short>();
    if ((int)uVar6 < iVar8) {
      pIVar10 = (InputExc *)__cxa_allocate_exception(0x48);
      Iex_2_5::InputExc::InputExc(pIVar10,"Error uncompressing DWA data (corrupt header file).");
      __cxa_throw(pIVar10,&Iex_2_5::InputExc::typeinfo,Iex_2_5::InputExc::~InputExc);
    }
    local_58 = (ulong)local_e2 + local_58;
    if (local_50 < (ulong)(local_58 + local_d8)) {
      pIVar10 = (InputExc *)__cxa_allocate_exception(0x48);
      Iex_2_5::InputExc::InputExc(pIVar10,"Error uncompressing DWA data (truncated file).");
      __cxa_throw(pIVar10,&Iex_2_5::InputExc::typeinfo,Iex_2_5::InputExc::~InputExc);
    }
    std::
    vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>
    ::clear((vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>
             *)0x16cc1c);
    iVar8 = Xdr::size<unsigned_short>();
    local_e2 = local_e2 - (short)iVar8;
    while (local_e2 != 0) {
      Classifier::Classifier
                (in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8,
                 (int)((ulong)in_stack_fffffffffffffbb0 >> 0x20));
      std::
      vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>
      ::push_back((vector<Imf_2_5::DwaCompressor::Classifier,_std::allocator<Imf_2_5::DwaCompressor::Classifier>_>
                   *)CONCAT44(in_stack_fffffffffffffa34,in_stack_fffffffffffffa30),
                  (value_type *)CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28));
      sVar11 = Classifier::size((Classifier *)
                                CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20));
      local_e2 = local_e2 - (short)sVar11;
      Classifier::~Classifier((Classifier *)0x16ccc8);
    }
  }
  local_130 = 0;
  initializeBuffers(in_stack_fffffffffffffb30,in_stack_fffffffffffffb28);
  iVar8 = *(int *)((long)in_RDI + 0x14);
  iVar7 = (**(code **)(*in_RDI + 0x10))();
  if ((ulong)in_RDI[0x1c] < (ulong)(long)(iVar8 * iVar7)) {
    iVar8 = *(int *)((long)in_RDI + 0x14);
    iVar7 = (**(code **)(*in_RDI + 0x10))();
    in_RDI[0x1c] = (long)(iVar8 * iVar7);
    if ((in_RDI[0x1b] != 0) && ((void *)in_RDI[0x1b] != (void *)0x0)) {
      operator_delete__((void *)in_RDI[0x1b]);
    }
    iVar8 = *(int *)((long)in_RDI + 0x14);
    iVar7 = (**(code **)(*in_RDI + 0x10))();
    pvVar12 = operator_new__((long)(iVar8 * iVar7));
    in_RDI[0x1b] = (long)pvVar12;
  }
  local_138 = in_RDI[0x1b];
  local_140 = 0;
  if (in_RDI[0x15] != 0) {
    local_140 = in_RDI[0x15];
  }
  local_148 = 0;
  if (in_RDI[0x17] != 0) {
    local_148 = in_RDI[0x17];
  }
  local_150 = local_e0;
  local_158 = (long)local_e0 + local_90;
  local_160 = local_158 + local_98;
  local_168 = local_160 + local_a0;
  if (2 < local_80) {
    pIVar10 = (InputExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::InputExc::InputExc(pIVar10,"Invalid version of compressed data block");
    __cxa_throw(pIVar10,&Iex_2_5::InputExc::typeinfo,Iex_2_5::InputExc::~InputExc);
  }
  setupChannelData((DwaCompressor *)CONCAT44(in_stack_fffffffffffffa84,in_stack_fffffffffffffa80),
                   in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78,in_stack_fffffffffffffa74,
                   in_stack_fffffffffffffa70);
  if (local_90 != 0) {
    if ((ulong)in_RDI[0x20] < local_88) {
      pIVar10 = (InputExc *)__cxa_allocate_exception(0x48);
      Iex_2_5::InputExc::InputExc(pIVar10,"Error uncompressing DWA data(corrupt header).");
      __cxa_throw(pIVar10,&Iex_2_5::InputExc::typeinfo,Iex_2_5::InputExc::~InputExc);
    }
    local_170 = local_88;
    iVar8 = ::uncompress(in_RDI[0x1d],&local_170,local_150,local_90);
    if (iVar8 != 0) {
      pBVar13 = (BaseExc *)__cxa_allocate_exception(0x48);
      Iex_2_5::BaseExc::BaseExc(pBVar13,"Error uncompressing UNKNOWN data.");
      __cxa_throw(pBVar13,&Iex_2_5::BaseExc::typeinfo,Iex_2_5::BaseExc::~BaseExc);
    }
  }
  if (local_98 != 0) {
    if ((in_RDI[0x15] == 0) ||
       ((ulong)in_RDI[0x16] <= local_c0 * 2 && local_c0 * 2 - in_RDI[0x16] != 0)) {
      pIVar10 = (InputExc *)__cxa_allocate_exception(0x48);
      Iex_2_5::InputExc::InputExc(pIVar10,"Error uncompressing DWA data(corrupt header).");
      __cxa_throw(pIVar10,&Iex_2_5::InputExc::typeinfo,Iex_2_5::InputExc::~InputExc);
    }
    if (local_d0 == 0) {
      hufUncompress(in_stack_00004ea0,in_stack_00004e9c,in_stack_00004e90,in_stack_00004e8c);
    }
    else {
      if (local_d0 != 1) {
        pNVar14 = (NoImplExc *)__cxa_allocate_exception(0x48);
        Iex_2_5::NoImplExc::NoImplExc(pNVar14,"Unknown AC Compression");
        __cxa_throw(pNVar14,&Iex_2_5::NoImplExc::typeinfo,Iex_2_5::NoImplExc::~NoImplExc);
      }
      local_178 = (long)(int)local_c0 << 1;
      iVar8 = ::uncompress(in_RDI[0x15],&local_178,local_158,local_98);
      if (iVar8 != 0) {
        pIVar10 = (InputExc *)__cxa_allocate_exception(0x48);
        Iex_2_5::InputExc::InputExc(pIVar10,"Data decompression (zlib) failed.");
        __cxa_throw(pIVar10,&Iex_2_5::InputExc::typeinfo,Iex_2_5::InputExc::~InputExc);
      }
      if (local_c0 * 2 - local_178 != 0) {
        pIVar10 = (InputExc *)__cxa_allocate_exception(0x48);
        Iex_2_5::InputExc::InputExc(pIVar10,"AC data corrupt.");
        __cxa_throw(pIVar10,&Iex_2_5::InputExc::typeinfo,Iex_2_5::InputExc::~InputExc);
      }
    }
  }
  if (local_a0 != 0) {
    if ((ulong)in_RDI[0x18] <= local_c8 * 2 && local_c8 * 2 - in_RDI[0x18] != 0) {
      pIVar10 = (InputExc *)__cxa_allocate_exception(0x48);
      Iex_2_5::InputExc::InputExc(pIVar10,"Error uncompressing DWA data(corrupt header).");
      __cxa_throw(pIVar10,&Iex_2_5::InputExc::typeinfo,Iex_2_5::InputExc::~InputExc);
    }
    iVar8 = Zip::uncompress((Zip *)CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48),
                            (char *)CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),
                            in_stack_fffffffffffffa3c,
                            (char *)CONCAT44(in_stack_fffffffffffffa34,in_stack_fffffffffffffa30));
    if ((long)iVar8 != local_c8 * 2) {
      pBVar13 = (BaseExc *)__cxa_allocate_exception(0x48);
      Iex_2_5::BaseExc::BaseExc(pBVar13,"DC data corrupt.");
      __cxa_throw(pBVar13,&Iex_2_5::BaseExc::typeinfo,Iex_2_5::BaseExc::~BaseExc);
    }
  }
  if (local_b8 != 0) {
    if (((ulong)in_RDI[0x1a] < local_b0) || ((ulong)in_RDI[0x22] < local_b8)) {
      pIVar10 = (InputExc *)__cxa_allocate_exception(0x48);
      Iex_2_5::InputExc::InputExc(pIVar10,"Error uncompressing DWA data(corrupt header).");
      __cxa_throw(pIVar10,&Iex_2_5::InputExc::typeinfo,Iex_2_5::InputExc::~InputExc);
    }
    local_180 = local_b0;
    iVar8 = ::uncompress(in_RDI[0x19],&local_180,local_168,local_a8);
    if (iVar8 != 0) {
      pBVar13 = (BaseExc *)__cxa_allocate_exception(0x48);
      Iex_2_5::BaseExc::BaseExc(pBVar13,"Error uncompressing RLE data.");
      __cxa_throw(pBVar13,&Iex_2_5::BaseExc::typeinfo,Iex_2_5::BaseExc::~BaseExc);
    }
    if (local_180 != local_b0) {
      pBVar13 = (BaseExc *)__cxa_allocate_exception(0x48);
      Iex_2_5::BaseExc::BaseExc(pBVar13,"RLE data corrupted");
      __cxa_throw(pBVar13,&Iex_2_5::BaseExc::typeinfo,Iex_2_5::BaseExc::~BaseExc);
    }
    iVar8 = rleUncompress(in_stack_fffffffffffffa40,in_stack_fffffffffffffa3c,
                          (char *)CONCAT44(in_stack_fffffffffffffa34,in_stack_fffffffffffffa30),
                          (char *)CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28));
    if ((long)iVar8 != local_b8) {
      pBVar13 = (BaseExc *)__cxa_allocate_exception(0x48);
      Iex_2_5::BaseExc::BaseExc(pBVar13,"RLE data corrupted");
      __cxa_throw(pBVar13,&Iex_2_5::BaseExc::typeinfo,Iex_2_5::BaseExc::~BaseExc);
    }
  }
  std::
  vector<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
  ::size((vector<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
          *)(in_RDI + 0xc));
  std::allocator<bool>::allocator((allocator<bool> *)0x16d4e8);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)
             CONCAT44(in_stack_fffffffffffffa34,in_stack_fffffffffffffa30),
             CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28),
             (allocator_type *)CONCAT44(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20));
  std::allocator<bool>::~allocator((allocator<bool> *)0x16d514);
  std::
  vector<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
  ::size((vector<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
          *)(in_RDI + 0xc));
  std::allocator<std::vector<char_*,_std::allocator<char_*>_>_>::allocator
            ((allocator<std::vector<char_*,_std::allocator<char_*>_>_> *)0x16d542);
  std::
  vector<std::vector<char_*,_std::allocator<char_*>_>,_std::allocator<std::vector<char_*,_std::allocator<char_*>_>_>_>
  ::vector((vector<std::vector<char_*,_std::allocator<char_*>_>,_std::allocator<std::vector<char_*,_std::allocator<char_*>_>_>_>
            *)CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),
           CONCAT44(in_stack_fffffffffffffa3c,in_stack_fffffffffffffa38),
           (allocator_type *)CONCAT44(in_stack_fffffffffffffa34,in_stack_fffffffffffffa30));
  std::allocator<std::vector<char_*,_std::allocator<char_*>_>_>::~allocator
            ((allocator<std::vector<char_*,_std::allocator<char_*>_>_> *)0x16d56e);
  local_1d0 = 0;
  while( true ) {
    uVar15 = (ulong)local_1d0;
    sVar16 = std::
             vector<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
             ::size((vector<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
                     *)(in_RDI + 0xc));
    if (sVar16 <= uVar15) break;
    rVar21 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       ((vector<bool,_std::allocator<bool>_> *)
                        CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),
                        CONCAT44(in_stack_fffffffffffffa3c,in_stack_fffffffffffffa38));
    local_1e0 = rVar21;
    std::_Bit_reference::operator=(&local_1e0,false);
    local_1d0 = local_1d0 + 1;
  }
  local_138 = in_RDI[0x1b];
  local_1e4 = local_44;
  while( true ) {
    rVar21._M_mask = in_stack_fffffffffffffab8;
    rVar21._M_p = in_stack_fffffffffffffac0;
    if (local_48 < local_1e4) break;
    local_1e8 = 0;
    while( true ) {
      sVar16 = std::
               vector<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
               ::size((vector<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
                       *)(in_RDI + 0xc));
      if (sVar16 <= local_1e8) break;
      pvVar17 = std::
                vector<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
                ::operator[]((vector<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
                              *)(in_RDI + 0xc),(ulong)local_1e8);
      iVar8 = Imath_2_5::modp(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20);
      if (iVar8 == 0) {
        std::
        vector<std::vector<char_*,_std::allocator<char_*>_>,_std::allocator<std::vector<char_*,_std::allocator<char_*>_>_>_>
        ::operator[](local_1c8,(ulong)local_1e8);
        std::vector<char_*,_std::allocator<char_*>_>::push_back
                  ((vector<char_*,_std::allocator<char_*>_> *)
                   CONCAT44(in_stack_fffffffffffffa34,in_stack_fffffffffffffa30),
                   (value_type *)CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28));
        iVar8 = pvVar17->width;
        iVar7 = pixelTypeSize(in_stack_fffffffffffffa24);
        local_138 = local_138 + iVar8 * iVar7;
      }
      local_1e8 = local_1e8 + 1;
    }
    local_1e4 = local_1e4 + 1;
  }
  local_1f4 = 0;
  while( true ) {
    uVar15 = (ulong)local_1f4;
    sVar16 = std::
             vector<Imf_2_5::DwaCompressor::CscChannelSet,_std::allocator<Imf_2_5::DwaCompressor::CscChannelSet>_>
             ::size((vector<Imf_2_5::DwaCompressor::CscChannelSet,_std::allocator<Imf_2_5::DwaCompressor::CscChannelSet>_>
                     *)(in_RDI + 0xf));
    if (sVar16 <= uVar15) break;
    this_00 = (vector<Imf_2_5::DwaCompressor::CscChannelSet,_std::allocator<Imf_2_5::DwaCompressor::CscChannelSet>_>
               *)(in_RDI + 0xf);
    pvVar18 = std::
              vector<Imf_2_5::DwaCompressor::CscChannelSet,_std::allocator<Imf_2_5::DwaCompressor::CscChannelSet>_>
              ::operator[](this_00,(ulong)local_1f4);
    iVar8 = pvVar18->idx[0];
    pvVar18 = std::
              vector<Imf_2_5::DwaCompressor::CscChannelSet,_std::allocator<Imf_2_5::DwaCompressor::CscChannelSet>_>
              ::operator[](this_00,(ulong)local_1f4);
    iVar7 = pvVar18->idx[1];
    pvVar18 = std::
              vector<Imf_2_5::DwaCompressor::CscChannelSet,_std::allocator<Imf_2_5::DwaCompressor::CscChannelSet>_>
              ::operator[](this_00,(ulong)local_1f4);
    iVar1 = pvVar18->idx[2];
    std::
    vector<std::vector<char_*,_std::allocator<char_*>_>,_std::allocator<std::vector<char_*,_std::allocator<char_*>_>_>_>
    ::operator[](local_1c8,(long)iVar8);
    std::
    vector<std::vector<char_*,_std::allocator<char_*>_>,_std::allocator<std::vector<char_*,_std::allocator<char_*>_>_>_>
    ::operator[](local_1c8,(long)iVar7);
    std::
    vector<std::vector<char_*,_std::allocator<char_*>_>,_std::allocator<std::vector<char_*,_std::allocator<char_*>_>_>_>
    ::operator[](local_1c8,(long)iVar1);
    this_01 = (vector<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
               *)(in_RDI + 0xc);
    pvVar17 = std::
              vector<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
              ::operator[](this_01,(long)iVar8);
    in_stack_fffffffffffffa20 = pvVar17->width;
    pvVar17 = std::
              vector<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
              ::operator[](this_01,(long)iVar8);
    iVar2 = pvVar17->height;
    pvVar17 = std::
              vector<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
              ::operator[](this_01,(long)iVar8);
    in_stack_fffffffffffffa30 = pvVar17->type;
    pvVar17 = std::
              vector<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
              ::operator[](this_01,(long)iVar7);
    in_stack_fffffffffffffa38 = pvVar17->type;
    pvVar17 = std::
              vector<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
              ::operator[](this_01,(long)iVar1);
    in_stack_fffffffffffffa40 = pvVar17->type;
    LossyDctDecoderCsc::LossyDctDecoderCsc
              (in_stack_fffffffffffffa50,
               (vector<char_*,_std::allocator<char_*>_> *)
               CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48),
               (vector<char_*,_std::allocator<char_*>_> *)
               CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),
               (vector<char_*,_std::allocator<char_*>_> *)
               CONCAT44(in_stack_fffffffffffffa3c,in_stack_fffffffffffffa38),
               (char *)CONCAT44(in_stack_fffffffffffffa34,in_stack_fffffffffffffa30),
               (char *)CONCAT44(in_stack_fffffffffffffa2c,iVar2),in_stack_fffffffffffffa60,
               (int)in_stack_fffffffffffffa68,in_stack_fffffffffffffa70,in_stack_fffffffffffffa78,
               in_stack_fffffffffffffa80,in_stack_fffffffffffffa88);
    LossyDctDecoderBase::execute(in_stack_fffffffffffffdb8);
    iVar8 = LossyDctDecoderBase::numAcValuesEncoded((LossyDctDecoderBase *)(local_290 + 1));
    local_140 = local_140 + (long)iVar8 * 2;
    iVar8 = LossyDctDecoderBase::numDcValuesEncoded((LossyDctDecoderBase *)(local_290 + 1));
    local_148 = local_148 + (long)iVar8 * 2;
    rVar21 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       ((vector<bool,_std::allocator<bool>_> *)
                        CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),
                        CONCAT44(in_stack_fffffffffffffa3c,in_stack_fffffffffffffa38));
    in_stack_fffffffffffffac8 = (char *)rVar21._M_mask;
    local_290[0] = rVar21;
    std::_Bit_reference::operator=(local_290,true);
    rVar21 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       ((vector<bool,_std::allocator<bool>_> *)
                        CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),
                        CONCAT44(in_stack_fffffffffffffa3c,in_stack_fffffffffffffa38));
    local_2a0 = rVar21;
    std::_Bit_reference::operator=(&local_2a0,true);
    rVar22 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       ((vector<bool,_std::allocator<bool>_> *)
                        CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),
                        CONCAT44(in_stack_fffffffffffffa3c,in_stack_fffffffffffffa38));
    local_2b0._M_mask = rVar22._M_mask;
    in_stack_fffffffffffffab0 = rVar22._M_p;
    local_2b0._M_p = in_stack_fffffffffffffab0;
    std::_Bit_reference::operator=(&local_2b0,true);
    LossyDctDecoderCsc::~LossyDctDecoderCsc((LossyDctDecoderCsc *)0x16dba4);
    local_1f4 = local_1f4 + 1;
  }
  local_2b4 = 0;
  do {
    uVar15 = (ulong)local_2b4;
    sVar16 = std::
             vector<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
             ::size((vector<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
                     *)(in_RDI + 0xc));
    if (sVar16 <= uVar15) {
      *local_38 = in_RDI[0x1b];
      iVar8 = (int)local_138 - (int)in_RDI[0x1b];
      std::
      vector<std::vector<char_*,_std::allocator<char_*>_>,_std::allocator<std::vector<char_*,_std::allocator<char_*>_>_>_>
      ::~vector((vector<std::vector<char_*,_std::allocator<char_*>_>,_std::allocator<std::vector<char_*,_std::allocator<char_*>_>_>_>
                 *)CONCAT44(in_stack_fffffffffffffa34,in_stack_fffffffffffffa30));
      std::vector<bool,_std::allocator<bool>_>::~vector
                ((vector<bool,_std::allocator<bool>_> *)0x16e24c);
      return iVar8;
    }
    rVar22 = std::vector<bool,_std::allocator<bool>_>::operator[]
                       ((vector<bool,_std::allocator<bool>_> *)
                        CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),
                        CONCAT44(in_stack_fffffffffffffa3c,in_stack_fffffffffffffa38));
    local_2c8 = rVar22;
    bVar5 = std::_Bit_reference::operator_cast_to_bool(&local_2c8);
    if (!bVar5) {
      local_2d0 = std::
                  vector<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
                  ::operator[]((vector<Imf_2_5::DwaCompressor::ChannelData,_std::allocator<Imf_2_5::DwaCompressor::ChannelData>_>
                                *)(in_RDI + 0xc),(ulong)local_2b4);
      local_2d4 = pixelTypeSize(in_stack_fffffffffffffa24);
      CVar3 = local_2d0->compression;
      if (CVar3 == UNKNOWN) {
        local_37c = 0;
        iVar8 = local_2d0->width;
        local_380 = pixelTypeSize(in_stack_fffffffffffffa24);
        local_380 = iVar8 * local_380;
        for (local_384 = local_44; local_384 <= local_48; local_384 = local_384 + 1) {
          iVar8 = Imath_2_5::modp(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20);
          if (iVar8 == 0) {
            if ((char *)(in_RDI[0x1d] + in_RDI[0x20]) < local_2d0->planarUncBufferEnd + local_380) {
              pIVar10 = (InputExc *)__cxa_allocate_exception(0x48);
              Iex_2_5::InputExc::InputExc(pIVar10,"DWA data corrupt");
              __cxa_throw(pIVar10,&Iex_2_5::InputExc::typeinfo,Iex_2_5::InputExc::~InputExc);
            }
            pvVar19 = std::
                      vector<std::vector<char_*,_std::allocator<char_*>_>,_std::allocator<std::vector<char_*,_std::allocator<char_*>_>_>_>
                      ::operator[](local_1c8,(ulong)local_2b4);
            ppcVar20 = std::vector<char_*,_std::allocator<char_*>_>::operator[]
                                 (pvVar19,(long)local_37c);
            memcpy(*ppcVar20,local_2d0->planarUncBufferEnd,(long)local_380);
            local_2d0->planarUncBufferEnd = local_2d0->planarUncBufferEnd + local_380;
            local_37c = local_37c + 1;
          }
        }
      }
      else if (CVar3 == LOSSY_DCT) {
        local_2e0 = (undefined1 *)0x0;
        if ((local_2d0->pLinear & 1U) == 0) {
          local_2e0 = dwaCompressorToLinear;
        }
        std::
        vector<std::vector<char_*,_std::allocator<char_*>_>,_std::allocator<std::vector<char_*,_std::allocator<char_*>_>_>_>
        ::operator[](local_1c8,(ulong)local_2b4);
        in_stack_fffffffffffffa20 = local_2d0->type;
        LossyDctDecoder::LossyDctDecoder
                  ((LossyDctDecoder *)in_stack_fffffffffffffa50,
                   (vector<char_*,_std::allocator<char_*>_> *)
                   CONCAT44(in_stack_fffffffffffffa4c,in_stack_fffffffffffffa48),
                   (char *)CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),
                   (char *)CONCAT44(in_stack_fffffffffffffa3c,in_stack_fffffffffffffa38),
                   (unsigned_short *)CONCAT44(in_stack_fffffffffffffa34,in_stack_fffffffffffffa30),
                   in_stack_fffffffffffffa2c,(int)in_stack_fffffffffffffa60,
                   (PixelType)in_stack_fffffffffffffa68);
        LossyDctDecoderBase::execute(in_stack_fffffffffffffdb8);
        iVar8 = LossyDctDecoderBase::numAcValuesEncoded(&local_360);
        local_140 = local_140 + (long)iVar8 * 2;
        iVar8 = LossyDctDecoderBase::numDcValuesEncoded(&local_360);
        local_148 = (long)iVar8 * 2 + local_148;
        LossyDctDecoder::~LossyDctDecoder((LossyDctDecoder *)0x16dded);
      }
      else {
        if (CVar3 != RLE) {
          pNVar14 = (NoImplExc *)__cxa_allocate_exception(0x48);
          Iex_2_5::NoImplExc::NoImplExc(pNVar14,"Unhandled compression scheme case");
          __cxa_throw(pNVar14,&Iex_2_5::NoImplExc::typeinfo,Iex_2_5::NoImplExc::~NoImplExc);
        }
        local_364 = 0;
        for (local_368 = local_44; local_368 <= local_48; local_368 = local_368 + 1) {
          iVar8 = Imath_2_5::modp(in_stack_fffffffffffffa24,in_stack_fffffffffffffa20);
          if (iVar8 == 0) {
            pvVar19 = std::
                      vector<std::vector<char_*,_std::allocator<char_*>_>,_std::allocator<std::vector<char_*,_std::allocator<char_*>_>_>_>
                      ::operator[](local_1c8,(ulong)local_2b4);
            ppcVar20 = std::vector<char_*,_std::allocator<char_*>_>::operator[]
                                 (pvVar19,(long)local_364);
            local_370 = *ppcVar20;
            if (local_2d4 == 2) {
              anon_unknown_9::interleaveByte2
                        (in_stack_fffffffffffffac8,(char *)rVar21._M_p,(char *)rVar21._M_mask,
                         (int)((ulong)in_stack_fffffffffffffab0 >> 0x20));
              local_2d0->planarUncRleEnd[0] = local_2d0->planarUncRleEnd[0] + local_2d0->width;
              local_2d0->planarUncRleEnd[1] = local_2d0->planarUncRleEnd[1] + local_2d0->width;
            }
            else {
              for (local_374 = 0; local_374 < local_2d0->width; local_374 = local_374 + 1) {
                for (local_378 = 0; local_378 < local_2d4; local_378 = local_378 + 1) {
                  pcVar4 = local_2d0->planarUncRleEnd[local_378];
                  local_2d0->planarUncRleEnd[local_378] = pcVar4 + 1;
                  *local_370 = *pcVar4;
                  local_370 = local_370 + 1;
                }
              }
            }
            local_364 = local_364 + 1;
          }
        }
      }
      rVar22 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         ((vector<bool,_std::allocator<bool>_> *)
                          CONCAT44(in_stack_fffffffffffffa44,in_stack_fffffffffffffa40),
                          CONCAT44(in_stack_fffffffffffffa3c,in_stack_fffffffffffffa38));
      in_stack_fffffffffffffa50 = (LossyDctDecoderCsc *)rVar22._M_mask;
      local_398 = rVar22;
      std::_Bit_reference::operator=(&local_398,true);
    }
    local_2b4 = local_2b4 + 1;
  } while( true );
}

Assistant:

int 
DwaCompressor::uncompress
    (const char *inPtr,
     int inSize,
     IMATH_NAMESPACE::Box2i range,
     const char *&outPtr)
{
    int minX = range.min.x;
    int maxX = std::min (range.max.x, _max[0]);
    int minY = range.min.y;
    int maxY = std::min (range.max.y, _max[1]);

    Int64 iSize = static_cast<Int64>( inSize );
    Int64 headerSize = NUM_SIZES_SINGLE*sizeof(Int64);
    if (iSize < headerSize) 
    {
        throw IEX_NAMESPACE::InputExc("Error uncompressing DWA data"
                            "(truncated header).");
    }

    // 
    // Flip the counters from XDR to NATIVE
    //

    for (int i = 0; i < NUM_SIZES_SINGLE; ++i)
    {
        Int64      *dst =  (((Int64 *)inPtr) + i);
        const char *src = (char *)(((Int64 *)inPtr) + i);

        Xdr::read<CharPtrIO> (src, *dst);
    }

    //
    // Unwind all the counter info
    //

    const Int64 *inPtr64 = (const Int64*) inPtr;

    Int64 version                  = *(inPtr64 + VERSION);
    Int64 unknownUncompressedSize  = *(inPtr64 + UNKNOWN_UNCOMPRESSED_SIZE);
    Int64 unknownCompressedSize    = *(inPtr64 + UNKNOWN_COMPRESSED_SIZE);
    Int64 acCompressedSize         = *(inPtr64 + AC_COMPRESSED_SIZE);
    Int64 dcCompressedSize         = *(inPtr64 + DC_COMPRESSED_SIZE);
    Int64 rleCompressedSize        = *(inPtr64 + RLE_COMPRESSED_SIZE);
    Int64 rleUncompressedSize      = *(inPtr64 + RLE_UNCOMPRESSED_SIZE);
    Int64 rleRawSize               = *(inPtr64 + RLE_RAW_SIZE);
 
    Int64 totalAcUncompressedCount = *(inPtr64 + AC_UNCOMPRESSED_COUNT); 
    Int64 totalDcUncompressedCount = *(inPtr64 + DC_UNCOMPRESSED_COUNT); 

    Int64 acCompression            = *(inPtr64 + AC_COMPRESSION); 

    Int64 compressedSize           = unknownCompressedSize + 
                                     acCompressedSize +
                                     dcCompressedSize +
                                     rleCompressedSize;

    const char *dataPtr            = inPtr + NUM_SIZES_SINGLE * sizeof(Int64);

    /* Both the sum and individual sizes are checked in case of overflow. */
    if (iSize < (headerSize + compressedSize) ||
        iSize < unknownCompressedSize ||
        iSize < acCompressedSize ||
        iSize < dcCompressedSize ||
        iSize < rleCompressedSize)
    {
        throw IEX_NAMESPACE::InputExc("Error uncompressing DWA data"
                            "(truncated file).");
    }

    if ((SInt64)unknownUncompressedSize < 0  ||
        (SInt64)unknownCompressedSize < 0    ||
        (SInt64)acCompressedSize < 0         ||
        (SInt64)dcCompressedSize < 0         ||
        (SInt64)rleCompressedSize < 0        ||
        (SInt64)rleUncompressedSize < 0      ||
        (SInt64)rleRawSize < 0               ||
        (SInt64)totalAcUncompressedCount < 0 ||
        (SInt64)totalDcUncompressedCount < 0)
    {
        throw IEX_NAMESPACE::InputExc("Error uncompressing DWA data"
                            " (corrupt header).");
    }

    if (version < 2) 
        initializeLegacyChannelRules();
    else
    {
        unsigned short ruleSize = 0;
        Xdr::read<CharPtrIO>(dataPtr, ruleSize);

        if (ruleSize < Xdr::size<unsigned short>() ) 
            throw IEX_NAMESPACE::InputExc("Error uncompressing DWA data"
                                " (corrupt header file).");

        headerSize += ruleSize;
        if (iSize < headerSize + compressedSize)
            throw IEX_NAMESPACE::InputExc("Error uncompressing DWA data"
                                " (truncated file).");

        _channelRules.clear();
        ruleSize -= Xdr::size<unsigned short> ();
        while (ruleSize > 0) 
        {
            Classifier rule(dataPtr, ruleSize);
            
            _channelRules.push_back(rule);
            ruleSize -= rule.size();
        }
    }


    size_t outBufferSize = 0;
    initializeBuffers(outBufferSize);

    //
    // Allocate _outBuffer, if we haven't done so already
    //

    if (static_cast<size_t>(_maxScanLineSize * numScanLines()) > _outBufferSize) 
    {
        _outBufferSize = static_cast<size_t>(_maxScanLineSize * numScanLines());
        if (_outBuffer != 0)
            delete[] _outBuffer;
        _outBuffer = new char[_maxScanLineSize * numScanLines()];
    }


    char *outBufferEnd = _outBuffer;

       
    //
    // Find the start of the RLE packed AC components and
    // the DC components for each channel. This will be handy   
    // if you want to decode the channels in parallel later on.
    //

    char *packedAcBufferEnd = 0; 

    if (_packedAcBuffer)
        packedAcBufferEnd = _packedAcBuffer;

    char *packedDcBufferEnd = 0;

    if (_packedDcBuffer)
        packedDcBufferEnd = _packedDcBuffer;

    //
    // UNKNOWN data is packed first, followed by the 
    // Huffman-compressed AC, then the DC values, 
    // and then the zlib compressed RLE data.
    //
    
    const char *compressedUnknownBuf = dataPtr;

    const char *compressedAcBuf      = compressedUnknownBuf + 
                                  static_cast<ptrdiff_t>(unknownCompressedSize);
    const char *compressedDcBuf      = compressedAcBuf +
                                  static_cast<ptrdiff_t>(acCompressedSize);
    const char *compressedRleBuf     = compressedDcBuf + 
                                  static_cast<ptrdiff_t>(dcCompressedSize);

    // 
    // Sanity check that the version is something we expect. Right now, 
    // we can decode version 0, 1, and 2. v1 adds 'end of block' symbols
    // to the AC RLE. v2 adds channel classification rules at the 
    // start of the data block.
    //

    if (version > 2)
        throw IEX_NAMESPACE::InputExc ("Invalid version of compressed data block");    

    setupChannelData(minX, minY, maxX, maxY);

    // 
    // Uncompress the UNKNOWN data into _planarUncBuffer[UNKNOWN]
    //

    if (unknownCompressedSize > 0)
    {
        if (unknownUncompressedSize > _planarUncBufferSize[UNKNOWN]) 
        {
            throw IEX_NAMESPACE::InputExc("Error uncompressing DWA data"
                                "(corrupt header).");
        }

        uLongf outSize = (uLongf)unknownUncompressedSize;

        if (Z_OK != ::uncompress
                        ((Bytef *)_planarUncBuffer[UNKNOWN],
                         &outSize,
                         (Bytef *)compressedUnknownBuf,
                         (uLong)unknownCompressedSize))
        {
            throw IEX_NAMESPACE::BaseExc("Error uncompressing UNKNOWN data.");
        }
    }

    // 
    // Uncompress the AC data into _packedAcBuffer
    //

    if (acCompressedSize > 0)
    {
        if ( !_packedAcBuffer || totalAcUncompressedCount*sizeof(unsigned short) > _packedAcBufferSize)
        {
            throw IEX_NAMESPACE::InputExc("Error uncompressing DWA data"
                                "(corrupt header).");
        }

        //
        // Don't trust the user to get it right, look in the file.
        //

        switch (acCompression)
        {
          case STATIC_HUFFMAN:

            hufUncompress
                (compressedAcBuf, 
                 (int)acCompressedSize, 
                 (unsigned short *)_packedAcBuffer, 
                 (int)totalAcUncompressedCount); 

            break;

          case DEFLATE:
            {
                uLongf destLen =
                    (int)(totalAcUncompressedCount) * sizeof (unsigned short);

                if (Z_OK != ::uncompress
                                ((Bytef *)_packedAcBuffer,
                                 &destLen,
                                 (Bytef *)compressedAcBuf,
                                 (uLong)acCompressedSize))
                {
                    throw IEX_NAMESPACE::InputExc ("Data decompression (zlib) failed.");
                }

                if (totalAcUncompressedCount * sizeof (unsigned short) !=
                                destLen)
                {
                    throw IEX_NAMESPACE::InputExc ("AC data corrupt.");     
                }
            }
            break;

          default:

            throw IEX_NAMESPACE::NoImplExc ("Unknown AC Compression");
            break;
        }
    }

    //
    // Uncompress the DC data into _packedDcBuffer
    //

    if (dcCompressedSize > 0)
    {
        if (totalDcUncompressedCount*sizeof(unsigned short) > _packedDcBufferSize)
        {
            throw IEX_NAMESPACE::InputExc("Error uncompressing DWA data"
                                "(corrupt header).");
        }

        if (static_cast<Int64>(_zip->uncompress
                    (compressedDcBuf, (int)dcCompressedSize, _packedDcBuffer))
            != totalDcUncompressedCount * sizeof (unsigned short))
        {
            throw IEX_NAMESPACE::BaseExc("DC data corrupt.");
        }
    }

    //
    // Uncompress the RLE data into _rleBuffer, then unRLE the results
    // into _planarUncBuffer[RLE]
    //

    if (rleRawSize > 0)
    {
        if (rleUncompressedSize > _rleBufferSize ||
            rleRawSize > _planarUncBufferSize[RLE])
        {
            throw IEX_NAMESPACE::InputExc("Error uncompressing DWA data"
                                "(corrupt header).");
        }
 
        uLongf dstLen = (uLongf)rleUncompressedSize;

        if (Z_OK != ::uncompress
                        ((Bytef *)_rleBuffer,
                         &dstLen,
                         (Bytef *)compressedRleBuf,
                         (uLong)rleCompressedSize))
        {
            throw IEX_NAMESPACE::BaseExc("Error uncompressing RLE data.");
        }

        if (dstLen != rleUncompressedSize)
            throw IEX_NAMESPACE::BaseExc("RLE data corrupted");

        if (static_cast<Int64>(rleUncompress
                ((int)rleUncompressedSize, 
                 (int)rleRawSize,
                 (signed char *)_rleBuffer,
                 _planarUncBuffer[RLE])) != rleRawSize)
        {        
            throw IEX_NAMESPACE::BaseExc("RLE data corrupted");
        }
    }

    //
    // Determine the start of each row in the output buffer
    //

    std::vector<bool> decodedChannels (_channelData.size());
    std::vector< std::vector<char *> > rowPtrs (_channelData.size());

    for (unsigned int chan = 0; chan < _channelData.size(); ++chan)
        decodedChannels[chan] = false;

    outBufferEnd = _outBuffer;

    for (int y = minY; y <= maxY; ++y)
    {
        for (unsigned int chan = 0; chan < _channelData.size(); ++chan)
        {
            ChannelData *cd = &_channelData[chan];

            if (IMATH_NAMESPACE::modp (y, cd->ySampling) != 0)
                continue;

            rowPtrs[chan].push_back (outBufferEnd);
            outBufferEnd += cd->width * OPENEXR_IMF_NAMESPACE::pixelTypeSize (cd->type);
        }
    }

    //
    // Setup to decode each block of 3 channels that need to
    // be handled together
    //

    for (unsigned int csc = 0; csc < _cscSets.size(); ++csc)
    {
        int rChan = _cscSets[csc].idx[0];    
        int gChan = _cscSets[csc].idx[1];    
        int bChan = _cscSets[csc].idx[2];    


        LossyDctDecoderCsc decoder
            (rowPtrs[rChan],
             rowPtrs[gChan],
             rowPtrs[bChan],
             packedAcBufferEnd,
             packedDcBufferEnd,
             dwaCompressorToLinear,
             _channelData[rChan].width,
             _channelData[rChan].height,
             _channelData[rChan].type,
             _channelData[gChan].type,
             _channelData[bChan].type);

        decoder.execute();

        packedAcBufferEnd +=
            decoder.numAcValuesEncoded() * sizeof (unsigned short);

        packedDcBufferEnd +=
            decoder.numDcValuesEncoded() * sizeof (unsigned short);

        decodedChannels[rChan] = true;
        decodedChannels[gChan] = true;
        decodedChannels[bChan] = true;
    }

    //
    // Setup to handle the remaining channels by themselves
    //

    for (unsigned int chan = 0; chan < _channelData.size(); ++chan)
    {
        if (decodedChannels[chan])
            continue;

        ChannelData *cd = &_channelData[chan];
        int pixelSize = OPENEXR_IMF_NAMESPACE::pixelTypeSize (cd->type);

        switch (cd->compression)
        {
          case LOSSY_DCT:

            //
            // Setup a single-channel lossy DCT decoder pointing
            // at the output buffer
            //

            {
                const unsigned short *linearLut = 0;

                if (!cd->pLinear)
                    linearLut = dwaCompressorToLinear;

                LossyDctDecoder decoder
                    (rowPtrs[chan],
                     packedAcBufferEnd,
                     packedDcBufferEnd,
                     linearLut,
                     cd->width,
                     cd->height,
                     cd->type);

                decoder.execute();   

                packedAcBufferEnd += 
                    decoder.numAcValuesEncoded() * sizeof (unsigned short);

                packedDcBufferEnd += 
                    decoder.numDcValuesEncoded() * sizeof (unsigned short);
            }

            break;

          case RLE:

            //
            // For the RLE case, the data has been un-RLE'd into
            // planarUncRleEnd[], but is still split out by bytes.
            // We need to rearrange the bytes back into the correct
            // order in the output buffer;
            //

            {
                int row = 0;

                for (int y = minY; y <= maxY; ++y)
                {
                    if (IMATH_NAMESPACE::modp (y, cd->ySampling) != 0)
                        continue;

                    char *dst = rowPtrs[chan][row];

                    if (pixelSize == 2)
                    {
                        interleaveByte2 (dst, 
                                         cd->planarUncRleEnd[0],
                                         cd->planarUncRleEnd[1],
                                         cd->width);
                                            
                        cd->planarUncRleEnd[0] += cd->width;
                        cd->planarUncRleEnd[1] += cd->width;
                    }
                    else
                    {
                        for (int x = 0; x < cd->width; ++x)
                        {
                            for (int byte = 0; byte < pixelSize; ++byte)
                            {
                               *dst++ = *cd->planarUncRleEnd[byte]++;
                            }
                        }
                    }

                    row++;
                }
            }

            break;

          case UNKNOWN:

            //
            // In the UNKNOWN case, data is already in planarUncBufferEnd
            // and just needs to copied over to the output buffer
            //

            {
                int row             = 0;
                int dstScanlineSize = cd->width * OPENEXR_IMF_NAMESPACE::pixelTypeSize (cd->type);

                for (int y = minY; y <= maxY; ++y)
                {
                    if (IMATH_NAMESPACE::modp (y, cd->ySampling) != 0)
                        continue;

                    //
                    // sanity check for buffer data lying within range
                    //
                    if ((cd->planarUncBufferEnd + static_cast<size_t>(dstScanlineSize))  > (_planarUncBuffer[UNKNOWN] + _planarUncBufferSize[UNKNOWN]) )
                    {
                        throw Iex::InputExc("DWA data corrupt");
                    }

                    memcpy (rowPtrs[chan][row],
                            cd->planarUncBufferEnd,
                            dstScanlineSize);

                    cd->planarUncBufferEnd += dstScanlineSize;
                    row++;
                }
            }

            break;

          default:

            throw IEX_NAMESPACE::NoImplExc ("Unhandled compression scheme case");
            break;
        }

        decodedChannels[chan] = true;
    }

    //
    // Return a ptr to _outBuffer
    //

    outPtr = _outBuffer;
    return (int)(outBufferEnd - _outBuffer);
}